

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_extension.cc
# Opt level: O0

void google::protobuf::compiler::javanano::SetVariables
               (FieldDescriptor *descriptor,Params *params,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  bool bVar2;
  Type TVar3;
  uint32 uVar4;
  WireType type;
  int iVar5;
  Params *pPVar6;
  mapped_type *pmVar7;
  char *pcVar8;
  FieldOptions *this;
  Descriptor *in_RCX;
  Descriptor *descriptor_00;
  uint i;
  JavaType type_00;
  uint i_00;
  uint i_01;
  FieldDescriptor *field;
  allocator local_4f9;
  key_type local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  undefined1 local_458 [8];
  string packed_tag;
  key_type local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  undefined1 local_390 [8];
  string non_packed_tag;
  key_type local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  allocator local_2e1;
  key_type local_2e0;
  string local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  allocator local_279;
  key_type local_278;
  allocator local_251;
  key_type local_250;
  string local_230;
  allocator local_209;
  key_type local_208;
  allocator local_1e1;
  key_type local_1e0;
  allocator local_1b9;
  key_type local_1b8;
  undefined1 local_198 [8];
  string message_type;
  key_type local_170;
  undefined1 local_150 [8];
  string tag;
  JavaType java_type;
  allocator local_101;
  key_type local_100;
  byte local_da;
  allocator local_d9;
  undefined1 local_d8 [6];
  bool repeated;
  string local_b8;
  string local_98;
  allocator local_61;
  key_type local_60;
  string local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_20;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  Params *params_local;
  FieldDescriptor *descriptor_local;
  
  local_20 = variables;
  variables_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)params;
  params_local = (Params *)descriptor;
  pPVar6 = (Params *)FieldDescriptor::containing_type(descriptor);
  ClassName_abi_cxx11_(&local_40,(javanano *)params,pPVar6,in_RCX);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"extends",&local_61);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_60);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string((string *)&local_40);
  UnderscoresToCamelCase_abi_cxx11_(&local_b8,(javanano *)params_local,field);
  RenameJavaKeywords(&local_98,&local_b8);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_d8,"name",&local_d9);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,(key_type *)local_d8);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_98);
  std::__cxx11::string::~string((string *)local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  local_da = FieldDescriptor::is_repeated((FieldDescriptor *)params_local);
  pmVar1 = local_20;
  descriptor_00 = (Descriptor *)0x61d661;
  pcVar8 = "";
  if ((bool)local_da) {
    pcVar8 = "Repeated";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"repeated",&local_101);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_100);
  std::__cxx11::string::operator=((string *)pmVar7,pcVar8);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  TVar3 = FieldDescriptor::type((FieldDescriptor *)params_local);
  pcVar8 = anon_unknown_6::GetTypeConstantName(TVar3);
  pmVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&java_type,"type",(allocator *)(tag.field_2._M_local_buf + 0xf));
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,(key_type *)&java_type);
  std::__cxx11::string::operator=((string *)pmVar7,pcVar8);
  std::__cxx11::string::~string((string *)&java_type);
  std::allocator<char>::~allocator((allocator<char> *)(tag.field_2._M_local_buf + 0xf));
  TVar3 = FieldDescriptor::type((FieldDescriptor *)params_local);
  tag.field_2._8_4_ = GetJavaType(TVar3);
  uVar4 = internal::WireFormat::MakeTag((FieldDescriptor *)params_local);
  SimpleItoa_abi_cxx11_((string *)local_150,(protobuf *)(ulong)uVar4,i);
  pmVar1 = local_20;
  if (tag.field_2._8_4_ == 8) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_170,"ext_type",
               (allocator *)(message_type.field_2._M_local_buf + 0xf));
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_170);
    std::__cxx11::string::operator=((string *)pmVar7,"MessageTyped");
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator((allocator<char> *)(message_type.field_2._M_local_buf + 0xf));
    pPVar6 = (Params *)FieldDescriptor::message_type((FieldDescriptor *)params_local);
    ClassName_abi_cxx11_((string *)local_198,(javanano *)params,pPVar6,descriptor_00);
    if ((local_da & 1) != 0) {
      std::__cxx11::string::operator+=((string *)local_198,"[]");
    }
    pmVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b8,"class",&local_1b9);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_1b8);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    pmVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e0,"tag_params",&local_1e1);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_1e0);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)local_150);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    std::__cxx11::string::~string((string *)local_198);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_208,"ext_type",&local_209);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_208);
    std::__cxx11::string::operator=((string *)pmVar7,"PrimitiveTyped");
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    if ((local_da & 1) == 0) {
      BoxedPrimitiveTypeName_abi_cxx11_
                (&local_230,(javanano *)(ulong)(uint)tag.field_2._8_4_,type_00);
      pmVar1 = local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_250,"class",&local_251);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_250);
      std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_230);
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator((allocator<char> *)&local_251);
      std::__cxx11::string::~string((string *)&local_230);
      pmVar1 = local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_278,"tag_params",&local_279);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_278);
      std::__cxx11::string::operator=((string *)pmVar7,(string *)local_150);
      std::__cxx11::string::~string((string *)&local_278);
      std::allocator<char>::~allocator((allocator<char> *)&local_279);
    }
    else {
      PrimitiveTypeName_abi_cxx11_(&local_2c0,(javanano *)(ulong)(uint)tag.field_2._8_4_,type_00);
      std::operator+(&local_2a0,&local_2c0,"[]");
      pmVar1 = local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2e0,"class",&local_2e1);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&local_2e0);
      std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_2c0);
      bVar2 = FieldDescriptor::is_packable((FieldDescriptor *)params_local);
      if (bVar2) {
        this = FieldDescriptor::options((FieldDescriptor *)params_local);
        bVar2 = FieldOptions::packed(this);
        if (bVar2) {
          iVar5 = FieldDescriptor::number((FieldDescriptor *)params_local);
          TVar3 = FieldDescriptor::type((FieldDescriptor *)params_local);
          type = internal::WireFormat::WireTypeForFieldType(TVar3);
          uVar4 = internal::WireFormatLite::MakeTag(iVar5,type);
          SimpleItoa_abi_cxx11_((string *)local_390,(protobuf *)(ulong)uVar4,i_00);
          std::operator+(&local_410,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_150,", ");
          std::operator+(&local_3f0,&local_410,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_390);
          std::operator+(&local_3d0,&local_3f0,", ");
          std::operator+(&local_3b0,&local_3d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_150);
          pmVar1 = local_20;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_430,"tag_params",
                     (allocator *)(packed_tag.field_2._M_local_buf + 0xf));
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar1,&local_430);
          std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_3b0);
          std::__cxx11::string::~string((string *)&local_430);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(packed_tag.field_2._M_local_buf + 0xf));
          std::__cxx11::string::~string((string *)&local_3b0);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::__cxx11::string::~string((string *)&local_3f0);
          std::__cxx11::string::~string((string *)&local_410);
          std::__cxx11::string::~string((string *)local_390);
        }
        else {
          iVar5 = FieldDescriptor::number((FieldDescriptor *)params_local);
          uVar4 = internal::WireFormatLite::MakeTag(iVar5,WIRETYPE_LENGTH_DELIMITED);
          SimpleItoa_abi_cxx11_((string *)local_458,(protobuf *)(ulong)uVar4,i_01);
          std::operator+(&local_4d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_150,", ");
          std::operator+(&local_4b8,&local_4d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_150);
          std::operator+(&local_498,&local_4b8,", ");
          std::operator+(&local_478,&local_498,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_458);
          pmVar1 = local_20;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_4f8,"tag_params",&local_4f9);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](pmVar1,&local_4f8);
          std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_478);
          std::__cxx11::string::~string((string *)&local_4f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
          std::__cxx11::string::~string((string *)&local_478);
          std::__cxx11::string::~string((string *)&local_498);
          std::__cxx11::string::~string((string *)&local_4b8);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::__cxx11::string::~string((string *)local_458);
        }
      }
      else {
        std::operator+(&local_348,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_150,", ");
        std::operator+(&local_328,&local_348,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_150);
        std::operator+(&local_308,&local_328,", 0");
        pmVar1 = local_20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_368,"tag_params",
                   (allocator *)(non_packed_tag.field_2._M_local_buf + 0xf));
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](pmVar1,&local_368);
        std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_308);
        std::__cxx11::string::~string((string *)&local_368);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(non_packed_tag.field_2._M_local_buf + 0xf));
        std::__cxx11::string::~string((string *)&local_308);
        std::__cxx11::string::~string((string *)&local_328);
        std::__cxx11::string::~string((string *)&local_348);
      }
    }
  }
  std::__cxx11::string::~string((string *)local_150);
  return;
}

Assistant:

void SetVariables(const FieldDescriptor* descriptor, const Params params,
                  map<string, string>* variables) {
  (*variables)["extends"] = ClassName(params, descriptor->containing_type());
  (*variables)["name"] = RenameJavaKeywords(UnderscoresToCamelCase(descriptor));
  bool repeated = descriptor->is_repeated();
  (*variables)["repeated"] = repeated ? "Repeated" : "";
  (*variables)["type"] = GetTypeConstantName(descriptor->type());
  JavaType java_type = GetJavaType(descriptor->type());
  string tag = SimpleItoa(WireFormat::MakeTag(descriptor));
  if (java_type == JAVATYPE_MESSAGE) {
    (*variables)["ext_type"] = "MessageTyped";
    string message_type = ClassName(params, descriptor->message_type());
    if (repeated) {
      message_type += "[]";
    }
    (*variables)["class"] = message_type;
    // For message typed extensions, tags_params contains a single tag
    // for both singular and repeated cases.
    (*variables)["tag_params"] = tag;
  } else {
    (*variables)["ext_type"] = "PrimitiveTyped";
    if (!repeated) {
      (*variables)["class"] = BoxedPrimitiveTypeName(java_type);
      (*variables)["tag_params"] = tag;
    } else {
      (*variables)["class"] = PrimitiveTypeName(java_type) + "[]";
      if (!descriptor->is_packable()) {
        // Non-packable: nonPackedTag == tag, packedTag == 0
        (*variables)["tag_params"] = tag + ", " + tag + ", 0";
      } else if (descriptor->options().packed()) {
        // Packable and packed: tag == packedTag
        string non_packed_tag = SimpleItoa(WireFormatLite::MakeTag(
            descriptor->number(),
            WireFormat::WireTypeForFieldType(descriptor->type())));
        (*variables)["tag_params"] = tag + ", " + non_packed_tag + ", " + tag;
      } else {
        // Packable and not packed: tag == nonPackedTag
        string packed_tag = SimpleItoa(WireFormatLite::MakeTag(
            descriptor->number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
        (*variables)["tag_params"] = tag + ", " + tag + ", " + packed_tag;
      }
    }
  }
}